

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QSize __thiscall
QStyleSheetStyle::defaultSize(QStyleSheetStyle *this,QWidget *w,QSize sz,QRect *rect,int pe)

{
  uint uVar1;
  Representation RVar2;
  Representation RVar3;
  QStyleSheetStyle *pQVar4;
  ulong uVar5;
  long lVar6;
  Representation RVar7;
  ulong uVar8;
  undefined8 uStack_40;
  
  uVar8 = (ulong)sz >> 0x20;
  pQVar4 = (QStyleSheetStyle *)baseStyle(this);
  RVar7 = sz.wd.m_i;
  RVar3 = sz.ht.m_i;
  switch(pe) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 9:
  case 0x12:
  case 0x13:
  case 0x28:
    sz = (QSize)((ulong)sz & 0xffffffff);
    if (RVar7.m_i == 0xffffffff) {
      sz.wd.m_i = 0xd;
      sz.ht.m_i = 0;
    }
    RVar7.m_i = 0xd;
    if (RVar3.m_i != 0xffffffff) {
      RVar7.m_i = RVar3.m_i;
    }
    uVar8 = (ulong)(uint)RVar7.m_i;
    goto LAB_00342d61;
  case 5:
  case 0x25:
    if (RVar7.m_i == 0xffffffff) {
      uVar1 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x25,0,w);
      sz.ht.m_i = 0;
      sz.wd.m_i = uVar1;
    }
    if (RVar3.m_i == 0xffffffff) {
      lVar6 = *(long *)pQVar4;
      uStack_40 = 0x26;
LAB_00342cb9:
      RVar2.m_i = (**(code **)(lVar6 + 0xe0))(pQVar4,uStack_40,0,w);
      goto LAB_00342d35;
    }
    goto LAB_00342d4d;
  case 6:
  case 0x10:
    if (RVar7.m_i == 0xffffffff) {
      uVar1 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x27,0,w);
      sz.ht.m_i = 0;
      sz.wd.m_i = uVar1;
    }
    if (RVar3.m_i == 0xffffffff) {
      lVar6 = *(long *)pQVar4;
      uStack_40 = 0x28;
      goto LAB_00342cb9;
    }
    goto LAB_00342d4d;
  case 7:
    lVar6 = *(long *)pQVar4;
    uStack_40 = 2;
    goto LAB_00342c39;
  case 8:
    RVar3.m_i = 0x10;
    if (RVar7.m_i != 0xffffffff) {
      RVar3.m_i = RVar7.m_i;
    }
LAB_00342db1:
    sz.ht.m_i = 0;
    sz.wd.m_i = RVar3.m_i;
    break;
  case 0xb:
  case 0xd:
    sz = (QSize)((ulong)sz & 0xffffffff);
    if (RVar7.m_i == 0xffffffff) {
      sz.wd.m_i = 0x10;
      sz.ht.m_i = 0;
    }
    if (RVar3.m_i != 0xffffffff) goto LAB_00342d61;
    RVar2.m_i = (((rect->y2).m_i - (rect->y1).m_i) + 1) / 2;
    goto LAB_00342d35;
  case 0x11:
    if (RVar7.m_i == 0xffffffff) {
      RVar3.m_i = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,2,0,w);
      goto LAB_00342db1;
    }
    break;
  case 0x15:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    lVar6 = *(long *)this;
    uStack_40 = 9;
    pQVar4 = this;
LAB_00342c39:
    uVar5 = (**(code **)(lVar6 + 0xe0))(pQVar4,uStack_40,0,w);
    RVar2.m_i = (int)uVar5;
    sz = (QSize)((ulong)sz & 0xffffffff);
    if (RVar7.m_i == 0xffffffff) {
      sz = (QSize)(uVar5 & 0xffffffff);
    }
    if (RVar3.m_i == 0xffffffff) goto LAB_00342d35;
    goto LAB_00342d4d;
  case 0x2b:
  case 0x2c:
    RVar2.m_i = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x2e,0,w);
    sz = (QSize)((ulong)sz & 0xffffffff);
    if (RVar7.m_i == 0xffffffff) {
      sz.ht.m_i = 0;
      sz.wd.m_i = RVar2.m_i;
    }
    if (RVar3.m_i != 1) {
      RVar2.m_i = RVar3.m_i;
    }
LAB_00342d35:
    uVar8 = (ulong)(uint)RVar2.m_i;
    break;
  case 0x3b:
  case 0x3c:
    uVar1 = (**(code **)(*(long *)this + 0xe0))(this,0x3e,0,w);
    uVar8 = (ulong)uVar1;
    sz.ht.m_i = 0;
    sz.wd.m_i = uVar1;
    goto LAB_00342d61;
  }
  if ((int)uVar8 == -1) {
    uVar8 = (ulong)(((rect->y2).m_i - (rect->y1).m_i) + 1);
  }
LAB_00342d4d:
  if (sz.wd.m_i.m_i == -1) {
    sz.wd.m_i = ((rect->x2).m_i - (rect->x1).m_i) + 1;
    sz.ht.m_i = 0;
  }
LAB_00342d61:
  return (QSize)((ulong)sz & 0xffffffff | uVar8 << 0x20);
}

Assistant:

QSize QStyleSheetStyle::defaultSize(const QWidget *w, QSize sz, const QRect& rect, int pe) const
{
    QStyle *base = baseStyle();

    switch (pe) {
    case PseudoElement_Indicator:
    case PseudoElement_MenuCheckMark:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_IndicatorWidth, nullptr, w));
        if (sz.height() == -1)
            sz.setHeight(base->pixelMetric(PM_IndicatorHeight, nullptr, w));
        break;

    case PseudoElement_ExclusiveIndicator:
    case PseudoElement_GroupBoxIndicator:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_ExclusiveIndicatorWidth, nullptr, w));
        if (sz.height() == -1)
            sz.setHeight(base->pixelMetric(PM_ExclusiveIndicatorHeight, nullptr, w));
        break;

    case PseudoElement_PushButtonMenuIndicator: {
        int pm = base->pixelMetric(PM_MenuButtonIndicator, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == -1)
            sz.setHeight(pm);
                                      }
        break;

    case PseudoElement_ComboBoxDropDown:
        if (sz.width() == -1)
            sz.setWidth(16);
        break;

    case PseudoElement_ComboBoxArrow:
    case PseudoElement_DownArrow:
    case PseudoElement_UpArrow:
    case PseudoElement_LeftArrow:
    case PseudoElement_RightArrow:
    case PseudoElement_ToolButtonMenuArrow:
    case PseudoElement_ToolButtonMenuIndicator:
    case PseudoElement_MenuRightArrow:
        if (sz.width() == -1)
            sz.setWidth(13);
        if (sz.height() == -1)
            sz.setHeight(13);
        break;

    case PseudoElement_SpinBoxUpButton:
    case PseudoElement_SpinBoxDownButton:
        if (sz.width() == -1)
            sz.setWidth(16);
        if (sz.height() == -1)
            sz.setHeight(rect.height()/2);
        break;

    case PseudoElement_ToolButtonMenu:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_MenuButtonIndicator, nullptr, w));
        break;

    case PseudoElement_HeaderViewUpArrow:
    case PseudoElement_HeaderViewDownArrow: {
        int pm = base->pixelMetric(PM_HeaderMargin, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == 1)
            sz.setHeight(pm);
        break;
                                            }

    case PseudoElement_ScrollBarFirst:
    case PseudoElement_ScrollBarLast:
    case PseudoElement_ScrollBarAddLine:
    case PseudoElement_ScrollBarSubLine:
    case PseudoElement_ScrollBarSlider: {
        int pm = pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == -1)
            sz.setHeight(pm);
        break;
                                        }

    case PseudoElement_DockWidgetCloseButton:
    case PseudoElement_DockWidgetFloatButton: {
        int iconSize = pixelMetric(PM_SmallIconSize, nullptr, w);
        return QSize(iconSize, iconSize);
                                              }

    default:
        break;
    }

    // expand to rectangle
    if (sz.height() == -1)
        sz.setHeight(rect.height());
    if (sz.width() == -1)
        sz.setWidth(rect.width());

    return sz;
}